

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbsdf.c
# Opt level: O2

FT_Error bsdf_raster_render(FT_Raster raster,FT_Raster_Params *params)

{
  undefined8 *puVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  FT_Bitmap *pFVar5;
  FT_Error FVar6;
  FT_SDFFormat FVar7;
  uint uVar8;
  FT_16D16 FVar9;
  int *P;
  long lVar10;
  FT_Long FVar11;
  FT_Fixed FVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int *piVar17;
  ulong uVar18;
  uchar *puVar19;
  uint uVar20;
  FT_Int width;
  int *piVar21;
  ulong uVar22;
  ED *pEVar23;
  long lVar24;
  ED *pEVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  FT_Vector *vec;
  int iVar30;
  ED *pEVar31;
  FT_Error error;
  char local_101;
  ED *local_100;
  int *local_f8;
  long local_f0;
  long local_e8;
  ulong local_e0;
  int *local_d8;
  int *local_d0;
  long local_c8;
  ED *local_c0;
  long local_b8;
  int *local_b0;
  ED *local_a8;
  int local_9c;
  long local_98;
  long local_90;
  FT_Vector local_88;
  ED *local_78;
  ulong local_70;
  int *local_68;
  int *local_60;
  ulong local_58;
  FT_Bitmap *local_50;
  FT_Memory local_48;
  long local_40;
  long local_38;
  
  error = 0;
  if (params == (FT_Raster_Params *)0x0 || raster == (FT_Raster)0x0) {
    return 6;
  }
  if (params->flags != 8) {
    return 0x61;
  }
  pFVar5 = params->target;
  piVar21 = (int *)params->source;
  if (pFVar5 == (FT_Bitmap *)0x0 || piVar21 == (int *)0x0) {
    return 6;
  }
  local_48 = *(FT_Memory *)raster;
  if (local_48 == (FT_Memory)0x0) {
    return 0x20;
  }
  if (*(int *)&params[1].target - 0x21U < 0xffffffe1) {
    return 6;
  }
  P = (int *)ft_mem_qrealloc(local_48,(ulong)pFVar5->width << 5,0,(ulong)pFVar5->rows,(void *)0x0,
                             &error);
  FVar6 = error;
  if (error == 0) {
    uVar27 = pFVar5->width;
    local_e0 = (ulong)uVar27;
    iVar30 = piVar21[1];
    FVar6 = 6;
    local_f8 = P;
    if (iVar30 <= (int)uVar27) {
      uVar20 = pFVar5->rows;
      local_f0 = (long)(int)uVar20;
      iVar15 = *piVar21;
      if ((iVar15 <= (int)uVar20) && (cVar2 = *(char *)((long)piVar21 + 0x1a), cVar2 != '\0')) {
        local_e8 = (long)(int)uVar27;
        local_9c = *(int *)&params[1].target;
        local_101 = *(char *)((long)&params[1].target + 4);
        cVar3 = *(char *)((long)&params[1].target + 5);
        local_d8 = (int *)CONCAT71(local_d8._1_7_,cVar3);
        lVar14 = *(long *)(piVar21 + 4);
        lVar24 = (long)((int)(uVar27 - iVar30) / 2);
        local_c8 = (long)((int)(uVar20 - iVar15) / 2);
        local_50 = pFVar5;
        if (cVar2 == '\x01') {
          uVar22 = 0;
          uVar18 = 0;
          if (0 < (int)uVar27) {
            uVar18 = local_e0;
          }
          uVar26 = 0;
          if (0 < (int)uVar20) {
            uVar26 = (ulong)uVar20;
          }
          piVar17 = P + 6;
          for (; uVar22 != uVar26; uVar22 = uVar22 + 1) {
            lVar10 = uVar22 - local_c8;
            uVar13 = ~(uint)lVar10 + iVar15;
            if (cVar3 == '\0') {
              uVar13 = (uint)lVar10;
            }
            uVar16 = -lVar24;
            for (lVar29 = 0; uVar18 * 0x20 != lVar29; lVar29 = lVar29 + 0x20) {
              puVar1 = (undefined8 *)((long)piVar17 + lVar29 + -8);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)piVar17 + lVar29 + -0x18);
              *puVar1 = 0;
              puVar1[1] = 0;
              if (((long)uVar16 < (long)iVar30 && -1 < (long)uVar16) &&
                  (lVar10 < iVar15 && -1 < lVar10)) {
                *(char *)((long)piVar17 + lVar29) =
                     -((*(byte *)(lVar14 + (int)(((uint)(uVar16 >> 3) & 0x1fffffff) +
                                                piVar21[2] * uVar13)) >> (~(byte)uVar16 & 7) & 1) !=
                      0);
              }
              uVar16 = uVar16 + 1;
            }
            piVar17 = piVar17 + local_e8 * 8;
          }
        }
        else {
          if (cVar2 != '\x02') {
            FVar6 = 7;
            goto LAB_00200445;
          }
          uVar22 = 0;
          uVar18 = 0;
          if (0 < (int)uVar27) {
            uVar18 = local_e0;
          }
          uVar26 = 0;
          if (0 < (int)uVar20) {
            uVar26 = (ulong)uVar20;
          }
          piVar21 = P + 6;
          for (; uVar22 != uVar26; uVar22 = uVar22 + 1) {
            lVar10 = uVar22 - local_c8;
            uVar13 = ~(uint)lVar10 + iVar15;
            if (cVar3 == '\0') {
              uVar13 = (uint)lVar10;
            }
            lVar29 = -lVar24;
            for (lVar28 = 0; uVar18 * 0x20 != lVar28; lVar28 = lVar28 + 0x20) {
              puVar1 = (undefined8 *)((long)piVar21 + lVar28 + -8);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)piVar21 + lVar28 + -0x18);
              *puVar1 = 0;
              puVar1[1] = 0;
              if ((lVar29 < iVar30 && -1 < lVar29) && (lVar10 < iVar15 && -1 < lVar10)) {
                *(undefined1 *)((long)piVar21 + lVar28) =
                     *(undefined1 *)((int)(uVar13 * iVar30) + lVar14 + lVar29);
              }
              lVar29 = lVar29 + 1;
            }
            piVar21 = piVar21 + local_e8 * 8;
          }
        }
        error = 0;
        if (P == (int *)0x0) {
          return 6;
        }
        lVar14 = local_f0 + -1;
        local_d8 = (int *)(long)(int)(uVar27 - 1);
        local_58 = 0;
        if (0 < (int)uVar27) {
          local_58 = (ulong)uVar27;
        }
        local_78 = (ED *)0x0;
        if (0 < (int)uVar20) {
          local_78 = (ED *)(ulong)uVar20;
        }
        local_90 = local_e8 + -1;
        lVar24 = local_58 << 5;
        local_b8 = local_e8 * 0x20;
        local_60 = P + (long)(int)~uVar27 * 8 + 6;
        local_d0 = P + local_e8 * -8 + 0xe;
        local_68 = P + (ulong)(uVar27 - 1) * 8 + 6;
        local_b0 = P + local_e0 * 8 + 0xe;
        pEVar23 = (ED *)P;
        pEVar25 = (ED *)0x0;
        local_98 = lVar14;
        local_40 = lVar24;
        while (pEVar25 != local_78) {
          local_c0 = (ED *)((long)&pEVar25->dist + 1);
          local_38 = (long)pEVar25 * local_e8;
          local_c8 = 0;
          local_100 = pEVar23;
          local_a8 = pEVar25;
          for (lVar10 = 0; lVar24 != lVar10; lVar10 = lVar10 + 0x20) {
            bVar4 = *(byte *)((long)pEVar23 + lVar10 + 0x18);
            if (bVar4 == 0) {
LAB_001ffe75:
              *(undefined4 *)((long)pEVar23 + lVar10) = 0x1900000;
              *(undefined8 *)((long)pEVar23 + lVar10 + 8) = 0xc80000;
              *(undefined8 *)((long)pEVar23 + lVar10 + 0x10) = 0xc80000;
            }
            else {
              if (bVar4 == 0xff) {
                if (pEVar25 == (ED *)0x0) {
                  iVar30 = 0;
                }
                else {
                  iVar30 = 1;
                  if (*(char *)((long)local_d0 + lVar10 + -0x20) == '\0') goto LAB_001ffe91;
                }
                if ((long)local_c0 < local_f0) {
                  if (*(char *)((long)local_b0 + lVar10 + -0x20) == '\0') goto LAB_001ffe91;
                  iVar30 = iVar30 + 1;
                }
                if (lVar10 == 0) {
LAB_001ffdd9:
                  if (local_c8 < local_90) {
                    if (*(char *)((long)pEVar23 + lVar10 + 0x38) == '\0') goto LAB_001ffe91;
                    iVar30 = iVar30 + 1;
                  }
                  if (pEVar25 != (ED *)0x0 && lVar10 != 0) {
                    if (*(char *)((long)local_d0 + lVar10 + -0x40) == '\0') goto LAB_001ffebc;
                    iVar30 = iVar30 + 1;
                  }
                  if ((pEVar25 != (ED *)0x0) && (local_c8 < local_90)) {
                    if (*(char *)((long)local_d0 + lVar10) == '\0') goto LAB_001ffe91;
                    iVar30 = iVar30 + 1;
                  }
                  if ((long)local_c0 < local_f0 && lVar10 != 0) {
                    if (*(char *)((long)local_b0 + lVar10 + -0x40) == '\0') goto LAB_001ffebc;
                    iVar30 = iVar30 + 1;
                  }
                  if (((((long)local_c0 < local_f0) && (local_c8 < local_90)) &&
                      (*(char *)((long)local_b0 + lVar10) != '\0')) && (iVar30 == 7))
                  goto LAB_001ffe75;
                  goto LAB_001ffe91;
                }
                if (*(char *)((long)pEVar23 + lVar10 + -8) != '\0') {
                  iVar30 = iVar30 + 1;
                  goto LAB_001ffdd9;
                }
LAB_001ffebc:
                piVar21 = (int *)((long)pEVar23 + lVar10);
LAB_001ffec4:
                vec = (FT_Vector *)(piVar21 + 2);
                if (((long)local_d8 <= local_c8 || lVar14 <= (long)pEVar25) || pEVar25 == (ED *)0x0)
                goto LAB_001ffff2;
                iVar30 = (uint)*(byte *)((long)local_d0 + lVar10) * 0x100;
                iVar15 = (uint)*(byte *)((long)local_68 + lVar10) * 0x100;
                lVar24 = (ulong)*(byte *)((long)local_b0 + lVar10) * 0x100;
                local_88.x = (int)(((iVar30 + (uint)*(byte *)((long)local_60 + lVar10) * -0x100) -
                                   ((int)((ulong)*(byte *)((long)pEVar23 + lVar10 + -8) * 0x16a0900
                                          + 0x8000 >> 0x10) + iVar15)) +
                                  (int)((ulong)*(byte *)((long)pEVar23 + lVar10 + 0x38) * 0x16a0900
                                        + 0x8000 >> 0x10)) + lVar24;
                local_88.y = (FT_Pos)(int)((int)((ulong)*(byte *)((long)local_b0 + lVar10 + -0x20) *
                                                 0x16a0900 + 0x8000 >> 0x10) + (int)lVar24 +
                                          (iVar15 - (iVar30 + (uint)*(byte *)((long)local_60 +
                                                                             lVar10) * 0x100 +
                                                    (int)((ulong)*(byte *)((long)local_d0 +
                                                                          lVar10 + -0x20) *
                                                          0x16a0900 + 0x8000 >> 0x10))));
                FT_Vector_NormLen(&local_88);
                uVar27 = (uint)((ulong)bVar4 * 0x100);
                if (local_88.y == 0 || local_88.x == 0) {
                  iVar30 = 0x8000 - uVar27;
                }
                else {
                  uVar13 = (uint)local_88.x;
                  uVar20 = -uVar13;
                  if (0 < (int)uVar13) {
                    uVar20 = uVar13;
                  }
                  uVar8 = (uint)local_88.y;
                  uVar13 = -uVar8;
                  if (0 < (int)uVar8) {
                    uVar13 = uVar8;
                  }
                  uVar8 = uVar13;
                  if (uVar20 < uVar13) {
                    uVar8 = uVar20;
                  }
                  uVar18 = (ulong)uVar8;
                  uVar8 = uVar13;
                  if (uVar13 < uVar20) {
                    uVar8 = uVar20;
                  }
                  local_70 = (ulong)uVar8;
                  FVar11 = FT_DivFix(uVar18,local_70);
                  iVar30 = (int)(FVar11 / 2);
                  if ((int)uVar27 < iVar30) {
                    FVar9 = square_root((uint)((uVar18 * (ulong)bVar4 * 0x100 + 0x8000 >> 0x10) *
                                               local_70 + 0x8000 >> 0xf) & 0xfffffffe);
                    iVar30 = (uVar13 + uVar20 >> 1) - FVar9;
                    P = local_f8;
                    lVar14 = local_98;
                  }
                  else if (uVar27 < 0x10000U - iVar30) {
                    lVar14 = local_70 * (long)(int)(0x8000 - uVar27);
                    iVar30 = (int)((ulong)(lVar14 + (lVar14 >> 0x3f) + 0x8000) >> 0x10);
                    P = local_f8;
                    lVar14 = local_98;
                  }
                  else {
                    FVar9 = square_root((uint)((uVar18 * (0x10000 - uVar27) + 0x8000 >> 0x10) *
                                               local_70 + 0x8000 >> 0xf) & 0xfffffffe);
                    iVar30 = FVar9 - (uVar13 + uVar20 >> 1);
                    P = local_f8;
                    lVar14 = local_98;
                  }
                }
                lVar24 = (long)(int)local_88.x * (long)iVar30;
                lVar29 = (long)(int)((ulong)(lVar24 + 0x8000 + (lVar24 >> 0x3f)) >> 0x10);
                lVar24 = (long)(int)local_88.y * (long)iVar30;
                lVar28 = (long)(int)((ulong)(lVar24 + 0x8000 + (lVar24 >> 0x3f)) >> 0x10);
                pEVar23 = local_100;
                lVar24 = local_40;
              }
              else {
LAB_001ffe91:
                if (lVar10 != 0) {
                  piVar21 = P + (local_c8 + local_38) * 8;
                  goto LAB_001ffec4;
                }
                vec = (FT_Vector *)((long)pEVar23 + 8);
LAB_001ffff2:
                lVar28 = 0;
                lVar29 = 0;
              }
              vec->x = lVar29;
              *(long *)((long)pEVar23 + lVar10 + 0x10) = lVar28;
              FVar12 = FT_Vector_Length(vec);
              *(int *)((long)local_100 + lVar10) = (int)FVar12;
              pEVar23 = local_100;
              pEVar25 = local_a8;
            }
            local_c8 = local_c8 + 1;
          }
          pEVar23 = (ED *)((long)pEVar23 + local_b8);
          local_60 = (int *)((long)local_60 + local_b8);
          local_d0 = (int *)((long)local_d0 + local_b8);
          local_68 = (int *)((long)local_68 + local_b8);
          local_b0 = (int *)((long)local_b0 + local_b8);
          pEVar25 = local_c0;
        }
        error = 0;
        iVar30 = (int)local_e0;
        local_c8 = (long)(iVar30 + -2);
        pEVar23 = (ED *)((long)P + local_b8 + 0x20);
        local_c0 = (ED *)(local_c8 * 0x20);
        local_100 = (ED *)((long)P + (long)local_c0 + local_b8);
        for (lVar14 = 1; uVar18 = local_e0, lVar14 < local_f0; lVar14 = lVar14 + 1) {
          local_a8 = pEVar23;
          for (lVar24 = 1; lVar10 = local_c8, pEVar25 = local_100, lVar24 < (long)local_d8;
              lVar24 = lVar24 + 1) {
            compare_neighbor(pEVar23,-1,-1,iVar30);
            compare_neighbor(pEVar23,0,-1,iVar30);
            compare_neighbor(pEVar23,1,-1,(FT_Int)local_e8);
            compare_neighbor(pEVar23,-1,0,iVar30);
            pEVar23 = pEVar23 + 1;
          }
          for (; -1 < lVar10; lVar10 = lVar10 + -1) {
            compare_neighbor(pEVar25,1,0,(FT_Int)local_e8);
            pEVar25 = pEVar25 + -1;
          }
          pEVar23 = (ED *)((long)&local_a8->dist + local_b8);
          local_100 = (ED *)((long)&local_100->dist + local_b8);
        }
        pEVar23 = (ED *)(long)((int)local_f0 + -2);
        pEVar25 = (ED *)(local_f8 + local_e8 * (long)pEVar23 * 8 + 8);
        local_d0 = (int *)-local_b8;
        pEVar31 = (ED *)((long)local_f8 + local_e8 * (long)pEVar23 * 0x20 + (long)local_c0);
        while (-1 < (long)pEVar23) {
          local_100 = pEVar23;
          local_a8 = pEVar25;
          for (lVar14 = 1; lVar24 = local_c8, pEVar23 = pEVar31, lVar14 < (long)local_d8;
              lVar14 = lVar14 + 1) {
            width = (FT_Int)uVar18;
            compare_neighbor(pEVar25,-1,1,width);
            compare_neighbor(pEVar25,0,1,width);
            compare_neighbor(pEVar25,1,1,(FT_Int)local_e8);
            compare_neighbor(pEVar25,-1,0,width);
            pEVar25 = pEVar25 + 1;
          }
          for (; -1 < lVar24; lVar24 = lVar24 + -1) {
            compare_neighbor(pEVar23,1,0,(FT_Int)local_e8);
            pEVar23 = pEVar23 + -1;
          }
          pEVar25 = (ED *)((long)&local_a8->dist + (long)local_d0);
          pEVar31 = (ED *)((long)&pEVar31->dist + (long)local_d0);
          pEVar23 = (ED *)&local_100[-1].field_0x1f;
        }
        error = 0;
        P = local_f8;
        FVar6 = 6;
        if ((local_50->width == (uint)local_e0) && (local_50->rows == (uint)local_f0)) {
          puVar19 = local_50->buffer;
          local_9c = local_9c << 0x10;
          uVar18 = local_58 & 0xffffffff;
          piVar21 = local_f8;
          for (pEVar23 = (ED *)0x0; P = local_f8, FVar6 = 0, pEVar23 != local_78;
              pEVar23 = (ED *)((long)&pEVar23->dist + 1)) {
            local_d8 = piVar21;
            for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
              iVar30 = *piVar21;
              iVar15 = local_9c;
              if (iVar30 < local_9c) {
                iVar15 = iVar30;
              }
              if (iVar30 < 0) {
                iVar15 = local_9c;
              }
              iVar30 = -iVar15;
              if (*(byte *)(piVar21 + 6) < 0x7f != (local_101 == '\0')) {
                iVar30 = iVar15;
              }
              FVar7 = map_fixed_to_sdf(iVar30,local_9c);
              puVar19[uVar22] = FVar7;
              piVar21 = piVar21 + 8;
            }
            puVar19 = puVar19 + local_e8;
            piVar21 = (int *)((long)local_d8 + local_b8);
          }
        }
      }
    }
  }
LAB_00200445:
  error = FVar6;
  if (P != (int *)0x0) {
    ft_mem_free(local_48,P);
  }
  return error;
}

Assistant:

static FT_Error
  bsdf_raster_render( FT_Raster                raster,
                      const FT_Raster_Params*  params )
  {
    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = NULL;

    const FT_Bitmap*  source = NULL;
    const FT_Bitmap*  target = NULL;

    BSDF_TRaster*  bsdf_raster = (BSDF_TRaster*)raster;
    BSDF_Worker    worker;

    const SDF_Raster_Params*  sdf_params = (const SDF_Raster_Params*)params;


    worker.distance_map = NULL;

    /* check for valid parameters */
    if ( !raster || !params )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* check whether the flag is set */
    if ( sdf_params->root.flags != FT_RASTER_FLAG_SDF )
    {
      error = FT_THROW( Raster_Corrupted );
      goto Exit;
    }

    source = (const FT_Bitmap*)sdf_params->root.source;
    target = (const FT_Bitmap*)sdf_params->root.target;

    /* check source and target bitmap */
    if ( !source || !target )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    memory = bsdf_raster->memory;
    if ( !memory )
    {
      FT_TRACE0(( "bsdf_raster_render: Raster not set up properly,\n" ));
      FT_TRACE0(( "                    unable to find memory handle.\n" ));

      error = FT_THROW( Invalid_Handle );
      goto Exit;
    }

    /* check whether spread is set properly */
    if ( sdf_params->spread > MAX_SPREAD ||
         sdf_params->spread < MIN_SPREAD )
    {
      FT_TRACE0(( "bsdf_raster_render:"
                  " The `spread' field of `SDF_Raster_Params'\n" ));
      FT_TRACE0(( "                   "
                  " is invalid; the value of this field must be\n" ));
      FT_TRACE0(( "                   "
                  " within [%d, %d].\n",
                  MIN_SPREAD, MAX_SPREAD ));
      FT_TRACE0(( "                   "
                  " Also, you must pass `SDF_Raster_Params'\n" ));
      FT_TRACE0(( "                   "
                  " instead of the default `FT_Raster_Params'\n" ));
      FT_TRACE0(( "                   "
                  " while calling this function and set the fields\n" ));
      FT_TRACE0(( "                   "
                  " accordingly.\n" ));

      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* set up the worker */

    /* allocate the distance map */
    if ( FT_QALLOC_MULT( worker.distance_map, target->rows,
                         target->width * sizeof ( *worker.distance_map ) ) )
      goto Exit;

    worker.width  = (int)target->width;
    worker.rows   = (int)target->rows;
    worker.params = *sdf_params;

    FT_CALL( bsdf_init_distance_map( source, &worker ) );
    FT_CALL( bsdf_approximate_edge( &worker ) );
    FT_CALL( edt8( &worker ) );
    FT_CALL( finalize_sdf( &worker, target ) );

    FT_TRACE0(( "bsdf_raster_render: Total memory used = %ld\n",
                worker.width * worker.rows *
                  (long)sizeof ( *worker.distance_map ) ));

  Exit:
    if ( worker.distance_map )
      FT_FREE( worker.distance_map );

    return error;
  }